

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

bool __thiscall llvm::APFloat::bitwiseIsEqual(APFloat *this,APFloat *RHS)

{
  bool bVar1;
  fltSemantics *pfVar2;
  fltSemantics *pfVar3;
  APFloat *RHS_local;
  APFloat *this_local;
  
  pfVar2 = getSemantics(this);
  pfVar3 = getSemantics(RHS);
  if (pfVar2 == pfVar3) {
    pfVar2 = getSemantics(this);
    bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfVar2);
    if (bVar1) {
      this_local._7_1_ = detail::IEEEFloat::bitwiseIsEqual(&(this->U).IEEE,&(RHS->U).IEEE);
    }
    else {
      pfVar2 = getSemantics(this);
      bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(pfVar2);
      if (!bVar1) {
        llvm_unreachable_internal
                  ("Unexpected semantics",
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                   ,0x45f);
      }
      this_local._7_1_ =
           detail::DoubleAPFloat::bitwiseIsEqual
                     ((DoubleAPFloat *)&(this->U).IEEE,(DoubleAPFloat *)&(RHS->U).IEEE);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool bitwiseIsEqual(const APFloat &RHS) const {
    if (&getSemantics() != &RHS.getSemantics())
      return false;
    if (usesLayout<IEEEFloat>(getSemantics()))
      return U.IEEE.bitwiseIsEqual(RHS.U.IEEE);
    if (usesLayout<DoubleAPFloat>(getSemantics()))
      return U.Double.bitwiseIsEqual(RHS.U.Double);
    llvm_unreachable("Unexpected semantics");
  }